

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O2

void read_16_rgb_555_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)(int)(((length & 1U) + length) * 2);
  lVar2 = al_fread(f,buf,lVar4);
  uVar5 = 0;
  memset(buf + lVar2,0,lVar4 - lVar2);
  uVar3 = (ulong)(uint)length;
  if (length < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = *(ushort *)(buf + uVar5 * 2);
    *(uint *)(data + uVar5 * 4) =
         *(int *)(&_al_rgb_scale_5 + (uVar1 >> 3 & 0x7c)) << 8 |
         *(int *)(&_al_rgb_scale_5 + (ulong)(uVar1 & 0x1f) * 4) << 0x10 |
         *(uint *)(&_al_rgb_scale_5 + (uVar1 >> 8 & 0x7c)) | 0xff000000;
  }
  return;
}

Assistant:

static void read_16_rgb_555_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = (length + (length & 1)) * 2;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   (void)premul;

   for (i = 0; i < length; ++i) {
      uint16_t pixel = read_16le(buf + i*2);
      data32[i] = ALLEGRO_CONVERT_RGB_555_TO_ABGR_8888_LE(pixel);
   }
}